

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O3

void __thiscall TestRegistry::listTestLocations(TestRegistry *this,TestResult *result)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SimpleString testLocations;
  SimpleString testLocation;
  undefined1 auStack_68 [40];
  SimpleString local_40;
  UtestShell *this_00;
  
  auStack_68._16_8_ = result;
  SimpleString::SimpleString((SimpleString *)(auStack_68 + 0x18),"");
  this_00 = this->tests_;
  while (this_00 != (UtestShell *)0x0) {
    SimpleString::SimpleString(&local_40,"");
    UtestShell::getGroup((UtestShell *)auStack_68);
    SimpleString::operator+=(&local_40,(SimpleString *)auStack_68);
    SimpleString::~SimpleString((SimpleString *)auStack_68);
    SimpleString::operator+=(&local_40,".");
    UtestShell::getName((UtestShell *)auStack_68);
    SimpleString::operator+=(&local_40,(SimpleString *)auStack_68);
    SimpleString::~SimpleString((SimpleString *)auStack_68);
    SimpleString::operator+=(&local_40,".");
    UtestShell::getFile((UtestShell *)auStack_68);
    SimpleString::operator+=(&local_40,(SimpleString *)auStack_68);
    SimpleString::~SimpleString((SimpleString *)auStack_68);
    SimpleString::operator+=(&local_40,".");
    sVar2 = UtestShell::getLineNumber(this_00);
    StringFromFormat(auStack_68,"%d\n",sVar2 & 0xffffffff);
    SimpleString::operator+=(&local_40,(SimpleString *)auStack_68);
    SimpleString::~SimpleString((SimpleString *)auStack_68);
    SimpleString::operator+=((SimpleString *)(auStack_68 + 0x18),&local_40);
    SimpleString::~SimpleString(&local_40);
    iVar1 = (*this_00->_vptr_UtestShell[3])(this_00);
    this_00 = (UtestShell *)CONCAT44(extraout_var,iVar1);
  }
  pcVar3 = SimpleString::asCharString((SimpleString *)(auStack_68 + 0x18));
  (*(*(_func_int ***)auStack_68._16_8_)[0xe])(auStack_68._16_8_,pcVar3);
  SimpleString::~SimpleString((SimpleString *)(auStack_68 + 0x18));
  return;
}

Assistant:

void TestRegistry::listTestLocations(TestResult& result)
{
    SimpleString testLocations;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
            SimpleString testLocation;
            testLocation += test->getGroup();
            testLocation += ".";
            testLocation += test->getName();
            testLocation += ".";
            testLocation += test->getFile();
            testLocation += ".";
            testLocation += StringFromFormat("%d\n",(int) test->getLineNumber());

            testLocations += testLocation;
    }

    result.print(testLocations.asCharString());
}